

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O1

int __thiscall Imf_2_5::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  BaseExc *this_00;
  char *pcVar4;
  char cVar5;
  long lVar6;
  double dVar7;
  uLongf outSize;
  long local_20;
  
  lVar6 = (long)rawSize;
  if (0 < rawSize) {
    pcVar1 = raw + lVar6;
    pcVar4 = this->_tmpBuffer;
    do {
      *pcVar4 = *raw;
      if (pcVar1 <= raw + 1) break;
      pcVar4[rawSize + 1U >> 1] = raw[1];
      pcVar4 = pcVar4 + 1;
      raw = raw + 2;
    } while (raw < pcVar1);
  }
  if (1 < rawSize) {
    pcVar1 = this->_tmpBuffer;
    pcVar4 = pcVar1 + 1;
    cVar5 = *pcVar1;
    do {
      cVar2 = *pcVar4;
      *pcVar4 = (cVar2 - cVar5) + -0x80;
      pcVar4 = pcVar4 + 1;
      cVar5 = cVar2;
    } while (pcVar4 < pcVar1 + lVar6);
  }
  dVar7 = ceil((double)rawSize * 1.01);
  local_20 = (long)((int)dVar7 + 100);
  iVar3 = ::compress(compressed,&local_20,this->_tmpBuffer,lVar6);
  if (iVar3 == 0) {
    return (int)local_20;
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
  __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
}

Assistant:

int
Zip::compress(const char *raw, int rawSize, char *compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char *t1 = _tmpBuffer;
        char *t2 = _tmpBuffer + (rawSize + 1) / 2;
        const char *stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
            *(t1++) = *(raw++);
            else
            break;

            if (raw < stop)
            *(t2++) = *(raw++);
            else
            break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char *t    = (unsigned char *) _tmpBuffer + 1;
        unsigned char *stop = (unsigned char *) _tmpBuffer + rawSize;
        int p = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p = t[0];
            t[0] = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //

    uLongf outSize = int(ceil(rawSize * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *)compressed, &outSize,
                (const Bytef *) _tmpBuffer, rawSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    return outSize;
}